

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Read<signed_char>
Omega_h::inertia::mark_bisection_given_axis
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis)

{
  Vector<3> center_00;
  Read<double> *in_RCX;
  void *extraout_RDX;
  Real RVar1;
  Read<signed_char> RVar2;
  Read<double> local_120;
  Read<double> local_110;
  shared_ptr<Omega_h::Comm> local_100;
  Read<double> local_f0;
  Read<double> local_e0;
  shared_ptr<Omega_h::Comm> local_d0;
  undefined1 auStack_c0 [8];
  Vector<3> center;
  Read<double> local_98;
  shared_ptr<Omega_h::Comm> local_88;
  Real local_78;
  Real total_mass;
  Real tolerance_local;
  Reals *masses_local;
  Reals *coords_local;
  CommPtr *comm_local;
  Reals *local_40;
  Reals *local_38;
  ulong local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(in_RCX->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((in_RCX->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(in_RCX->write_).shared_alloc_.alloc >> 3;
  }
  total_mass = tolerance;
  masses_local = masses;
  coords_local = coords;
  comm_local = comm;
  local_40 = masses;
  local_38 = masses;
  local_18 = masses;
  if ((int)(local_10 >> 3) == (int)(local_20 >> 3) * 3) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_88,(shared_ptr<Omega_h::Comm> *)coords);
    Read<double>::Read(&local_98,in_RCX);
    RVar1 = repro_sum(&local_88,&local_98);
    Read<double>::~Read(&local_98);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_88);
    local_78 = RVar1;
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_d0,(shared_ptr<Omega_h::Comm> *)coords);
    Read<double>::Read(&local_e0,masses);
    Read<double>::Read(&local_f0,in_RCX);
    anon_unknown_0::get_center((Vector<3> *)auStack_c0,&local_d0,&local_e0,&local_f0,local_78);
    Read<double>::~Read(&local_f0);
    Read<double>::~Read(&local_e0);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_d0);
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_100,(shared_ptr<Omega_h::Comm> *)coords);
    Read<double>::Read(&local_110,masses);
    Read<double>::Read(&local_120,in_RCX);
    center_00.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[0] = (double)auStack_c0;
    center_00.super_Few<double,_3>.array_[2] = center.super_Few<double,_3>.array_[1];
    anon_unknown_0::mark_bisection_internal
              (comm,(Reals *)&local_100,&local_110,total_mass,axis,center_00,local_78);
    Read<double>::~Read(&local_120);
    Read<double>::~Read(&local_110);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_100);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)comm;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x9b);
}

Assistant:

Read<I8> mark_bisection_given_axis(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3> axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}